

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  char cVar1;
  char *pcVar2;
  int patternLength;
  bool bVar3;
  
  skipSpaces(this);
  pcVar2 = this->current_;
  token->start_ = pcVar2;
  if (pcVar2 == this->end_) {
LAB_0010f0dc:
    token->type_ = tokenEndOfStream;
    goto LAB_0010f0df;
  }
  this->current_ = pcVar2 + 1;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\"':
    token->type_ = tokenString;
    bVar3 = readString(this);
    break;
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case '(':
  case ')':
  case '*':
  case '+':
  case '.':
    goto switchD_0010f08b_caseD_23;
  case ',':
    token->type_ = tokenArraySeparator;
    goto LAB_0010f0df;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token->type_ = tokenNumber;
    readNumber(this);
    goto LAB_0010f0df;
  case '/':
    token->type_ = tokenComment;
    bVar3 = readComment(this);
    break;
  case ':':
    token->type_ = tokenMemberSeparator;
    goto LAB_0010f0df;
  default:
    if (cVar1 == '\0') goto LAB_0010f0dc;
    if (cVar1 == '[') {
      token->type_ = tokenArrayBegin;
      goto LAB_0010f0df;
    }
    if (cVar1 == ']') {
      token->type_ = tokenArrayEnd;
      goto LAB_0010f0df;
    }
    if (cVar1 == 'f') {
      token->type_ = tokenFalse;
      pcVar2 = "false";
      patternLength = 4;
    }
    else {
      if (cVar1 == 'n') {
        token->type_ = tokenNull;
        pcVar2 = "null";
      }
      else {
        if (cVar1 != 't') {
          if (cVar1 == '}') {
            token->type_ = tokenObjectEnd;
            goto LAB_0010f0df;
          }
          if (cVar1 == '{') {
            token->type_ = tokenObjectBegin;
            goto LAB_0010f0df;
          }
          goto switchD_0010f08b_caseD_23;
        }
        token->type_ = tokenTrue;
        pcVar2 = "true";
      }
      patternLength = 3;
    }
    bVar3 = match(this,pcVar2 + 1,patternLength);
  }
  if (bVar3 == false) {
switchD_0010f08b_caseD_23:
    token->type_ = tokenError;
  }
LAB_0010f0df:
  token->end_ = this->current_;
  return true;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}